

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

string * compute_U_value(string *__return_storage_ptr__,string *user_password,EncryptionData *data)

{
  uchar *puVar1;
  uchar *okey;
  EncryptionData *in_RCX;
  size_t n;
  uint i;
  long lVar2;
  ulong uVar3;
  string k1;
  char udata [32];
  MD5 md5;
  Digest digest;
  size_type __dnew;
  string local_b8;
  string local_98;
  MD5 local_78;
  string local_68;
  size_type local_40 [5];
  
  if (data->R < 3) {
    QPDF::compute_encryption_key(&local_b8,(QPDF *)user_password,(string *)data,in_RCX);
    local_98._M_dataplus._M_p = (pointer)0x418a754e5e4ebf28;
    local_98._M_string_length._0_1_ = 'd';
    local_98._M_string_length._1_1_ = '\0';
    local_98._M_string_length._2_1_ = 'N';
    local_98._M_string_length._3_1_ = 'V';
    local_98._M_string_length._4_1_ = 0xff;
    local_98._M_string_length._5_1_ = 0xfa;
    local_98._M_string_length._6_1_ = '\x01';
    local_98._M_string_length._7_1_ = '\b';
    local_98.field_2._M_local_buf[0] = '.';
    local_98.field_2._M_local_buf[1] = '.';
    local_98.field_2._M_local_buf[2] = '\0';
    local_98.field_2._M_local_buf[3] = 0xb6;
    local_98.field_2._M_local_buf[4] = 0xd0;
    local_98.field_2._M_local_buf[5] = 'h';
    local_98.field_2._M_local_buf[6] = '>';
    local_98.field_2._M_local_buf[7] = 0x80;
    local_98.field_2._M_local_buf[8] = '/';
    local_98.field_2._M_local_buf[9] = '\f';
    local_98.field_2._M_local_buf[10] = 0xa9;
    local_98.field_2._M_local_buf[0xb] = 0xfe;
    local_98.field_2._M_local_buf[0xc] = 'd';
    local_98.field_2._M_local_buf[0xd] = 'S';
    local_98.field_2._M_local_buf[0xe] = 'i';
    local_98.field_2._M_local_buf[0xf] = 'z';
    uVar3 = (ulong)data->Length_bytes;
    if ((long)uVar3 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(data->Length_bytes);
    }
    if (local_b8._M_string_length <= uVar3 && uVar3 - local_b8._M_string_length != 0) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&local_b8,local_b8._M_string_length,0,
                 (char)(uVar3 - local_b8._M_string_length));
    }
    puVar1 = QUtil::unsigned_char_pointer((char *)&local_98);
    okey = QUtil::unsigned_char_pointer(&local_b8);
    iterate_rc4(puVar1,0x20,okey,data->Length_bytes,1,false);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_68._M_dataplus._M_p = (pointer)0x20;
    puVar1 = (uchar *)std::__cxx11::string::_M_create
                                ((ulong *)__return_storage_ptr__,(ulong)&local_68);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)puVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
    *(size_type *)(puVar1 + 0x10) = local_98.field_2._M_allocated_capacity;
    *(undefined8 *)(puVar1 + 0x18) = local_98.field_2._8_8_;
    *(pointer *)puVar1 = local_98._M_dataplus._M_p;
    *(size_type *)(puVar1 + 8) = local_98._M_string_length;
    __return_storage_ptr__->_M_string_length = (size_type)local_68._M_dataplus._M_p;
    local_68._M_dataplus._M_p[(long)(__return_storage_ptr__->_M_dataplus)._M_p] = '\0';
  }
  else {
    QPDF::compute_encryption_key(&local_b8,(QPDF *)user_password,(string *)data,in_RCX);
    MD5::MD5(&local_78,(uchar *)user_password,n,(uchar *)in_RCX);
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pad_or_truncate_password_V4(&local_98,&local_68);
    MD5::encodeDataIncrementally(&local_78,local_98._M_dataplus._M_p,0x20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    MD5::encodeDataIncrementally
              (&local_78,(data->id1)._M_dataplus._M_p,(data->id1)._M_string_length);
    MD5::digest(&local_78,(uchar *)&local_68);
    uVar3 = (ulong)data->Length_bytes;
    if ((long)uVar3 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(data->Length_bytes);
    }
    if (local_b8._M_string_length <= uVar3 && uVar3 - local_b8._M_string_length != 0) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&local_b8,local_b8._M_string_length,0,
                 (char)(uVar3 - local_b8._M_string_length));
    }
    puVar1 = QUtil::unsigned_char_pointer(&local_b8);
    lVar2 = 0x10;
    iterate_rc4((uchar *)&local_68,0x10,puVar1,data->Length_bytes,0x14,false);
    local_98._M_dataplus._M_p = local_68._M_dataplus._M_p;
    local_98._M_string_length = local_68._M_string_length;
    do {
      *(char *)((long)&local_98._M_dataplus._M_p + lVar2) =
           (char)((ulong)(uint)((int)lVar2 * (int)lVar2) * 0x8080808081 >> 0x27);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_40[0] = 0x20;
    puVar1 = (uchar *)std::__cxx11::string::_M_create
                                ((ulong *)__return_storage_ptr__,(ulong)local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)puVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40[0];
    *(size_type *)(puVar1 + 0x10) = local_98.field_2._M_allocated_capacity;
    *(undefined8 *)(puVar1 + 0x18) = local_98.field_2._8_8_;
    *(pointer *)puVar1 = local_98._M_dataplus._M_p;
    *(size_type *)(puVar1 + 8) = local_98._M_string_length;
    __return_storage_ptr__->_M_string_length = local_40[0];
    (__return_storage_ptr__->_M_dataplus)._M_p[local_40[0]] = '\0';
    if (local_78.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string
compute_U_value(std::string const& user_password, QPDF::EncryptionData const& data)
{
    if (data.getR() >= 3) {
        return compute_U_value_R3(user_password, data);
    }

    return compute_U_value_R2(user_password, data);
}